

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

uint __thiscall llvm::ARM::parseArchExt(ARM *this,StringRef ArchExt)

{
  int iVar1;
  char *__n;
  long lVar2;
  
  __n = ArchExt.Data;
  lVar2 = 0x10;
  while( true ) {
    if (lVar2 == 0x358) {
      return 0;
    }
    if ((*(char **)(&UNK_001f5f68 + lVar2) == __n) &&
       ((__n == (char *)0x0 ||
        (iVar1 = bcmp(this,*(void **)(&UNK_001f5f60 + lVar2),(size_t)__n), iVar1 == 0)))) break;
    lVar2 = lVar2 + 0x28;
  }
  return *(uint *)((long)&(anonymous_namespace)::ARCHExtNames + lVar2);
}

Assistant:

unsigned llvm::ARM::parseArchExt(StringRef ArchExt) {
  for (const auto A : ARCHExtNames) {
    if (ArchExt == A.getName())
      return A.ID;
  }
  return ARM::AEK_INVALID;
}